

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h2h3.c
# Opt level: O0

header_instruction inspect_header(char *name,size_t namelen,char *value,size_t valuelen)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  size_t valuelen_local;
  char *value_local;
  size_t namelen_local;
  char *name_local;
  
  switch(namelen) {
  case 2:
    iVar2 = Curl_strncasecompare("te",name,namelen);
    if (iVar2 == 0) {
      name_local._4_4_ = HEADERINST_FORWARD;
    }
    else {
      _Var1 = contains_trailers(value,valuelen);
      name_local._4_4_ = HEADERINST_IGNORE;
      if (_Var1) {
        name_local._4_4_ = HEADERINST_TE_TRAILERS;
      }
    }
    break;
  default:
    name_local._4_4_ = HEADERINST_FORWARD;
    break;
  case 7:
    iVar2 = Curl_strncasecompare("upgrade",name,namelen);
    name_local._4_4_ = (header_instruction)(iVar2 != 0);
    break;
  case 10:
    iVar2 = Curl_strncasecompare("connection",name,namelen);
    bVar3 = true;
    if (iVar2 == 0) {
      iVar2 = Curl_strncasecompare("keep-alive",name,namelen);
      bVar3 = iVar2 != 0;
    }
    name_local._4_4_ = (header_instruction)bVar3;
    break;
  case 0x10:
    iVar2 = Curl_strncasecompare("proxy-connection",name,namelen);
    name_local._4_4_ = (header_instruction)(iVar2 != 0);
    break;
  case 0x11:
    iVar2 = Curl_strncasecompare("transfer-encoding",name,namelen);
    name_local._4_4_ = (header_instruction)(iVar2 != 0);
  }
  return name_local._4_4_;
}

Assistant:

static header_instruction inspect_header(const char *name, size_t namelen,
                                         const char *value, size_t valuelen) {
  switch(namelen) {
  case 2:
    if(!strncasecompare("te", name, namelen))
      return HEADERINST_FORWARD;

    return contains_trailers(value, valuelen) ?
           HEADERINST_TE_TRAILERS : HEADERINST_IGNORE;
  case 7:
    return strncasecompare("upgrade", name, namelen) ?
           HEADERINST_IGNORE : HEADERINST_FORWARD;
  case 10:
    return (strncasecompare("connection", name, namelen) ||
            strncasecompare("keep-alive", name, namelen)) ?
           HEADERINST_IGNORE : HEADERINST_FORWARD;
  case 16:
    return strncasecompare("proxy-connection", name, namelen) ?
           HEADERINST_IGNORE : HEADERINST_FORWARD;
  case 17:
    return strncasecompare("transfer-encoding", name, namelen) ?
           HEADERINST_IGNORE : HEADERINST_FORWARD;
  default:
    return HEADERINST_FORWARD;
  }
}